

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

string * __thiscall
ccs::ParserImpl::parseIdent_abi_cxx11_(string *__return_storage_ptr__,ParserImpl *this,char *what)

{
  Type TVar1;
  pointer pcVar2;
  pointer pSVar3;
  Location LVar4;
  string *psVar5;
  ostringstream _message;
  long local_1b8;
  long local_1b0;
  ostringstream local_198 [376];
  
  TVar1 = (this->cur_).type;
  if (TVar1 == STRING) {
    advance(this);
    pSVar3 = (this->last_).stringValue.elements_.
             super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((1 < (ulong)(((long)(this->last_).stringValue.elements_.
                            super__Vector_base<ccs::StringElem,_std::allocator<ccs::StringElem>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 3) *
                    -0x3333333333333333)) || (pSVar3->isInterpolant == true)) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Interpolation not allowed in ",0x1d);
      std::operator<<((ostream *)local_198,what);
      psVar5 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LVar4 = (this->last_).location;
      *(string **)psVar5 = psVar5 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar5,local_1b8,local_1b0 + local_1b8);
      *(Location *)(psVar5 + 0x20) = LVar4;
      __cxa_throw(psVar5,&(anonymous_namespace)::parse_error::typeinfo,
                  anon_unknown_0::parse_error::~parse_error);
    }
    StringVal::str_abi_cxx11_(__return_storage_ptr__,&(this->last_).stringValue);
  }
  else {
    if (TVar1 != IDENT) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      anon_unknown_0::operator<<((ostream *)local_198,(this->cur_).type);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198," cannot occur here. Expected ",0x1d);
      std::operator<<((ostream *)local_198,what);
      psVar5 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LVar4 = (this->cur_).location;
      *(string **)psVar5 = psVar5 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar5,local_1b8,local_1b0 + local_1b8);
      *(Location *)(psVar5 + 0x20) = LVar4;
      __cxa_throw(psVar5,&(anonymous_namespace)::parse_error::typeinfo,
                  anon_unknown_0::parse_error::~parse_error);
    }
    advance(this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->last_).value._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->last_).value._M_string_length
              );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string parseIdent(const char *what) {
    if (advanceIf(Token::IDENT)) return last_.value;
    if (advanceIf(Token::STRING)) {
      if (last_.stringValue.interpolation())
        THROW(last_.location, "Interpolation not allowed in " << what);
      return last_.stringValue.str();
    }
    THROW(cur_.location, cur_.type << " cannot occur here. Expected " << what);
  }